

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

QPDFObjectHandle __thiscall
QPDFObjectHandle::newArray
          (QPDFObjectHandle *this,vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *items
          )

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  QPDFObjectHandle QVar1;
  undefined1 local_28 [24];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *items_local;
  
  local_28._16_8_ = items;
  items_local = (vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)this;
  QPDFObject::
  create<QPDF_Array,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>const&>
            ((QPDFObject *)local_28,items);
  QPDFObjectHandle(this,(shared_ptr<QPDFObject> *)local_28);
  std::shared_ptr<QPDFObject>::~shared_ptr((shared_ptr<QPDFObject> *)local_28);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFObjectHandle::newArray(std::vector<QPDFObjectHandle> const& items)
{
    return {QPDFObject::create<QPDF_Array>(items)};
}